

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall helics::FederateState::addFederateToDelay(FederateState *this,GlobalFederateId gid)

{
  pointer pGVar1;
  pointer pGVar2;
  __normal_iterator<helics::GlobalFederateId_*,_std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>_>
  __position;
  value_type local_14;
  
  pGVar1 = (this->delayedFederates).
           super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pGVar2 = (this->delayedFederates).
           super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_14.gid = gid.gid;
  if (((pGVar1 != pGVar2) && (gid.gid <= pGVar2[-1].gid)) &&
     (__position = std::
                   __lower_bound<__gnu_cxx::__normal_iterator<helics::GlobalFederateId*,std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>>,helics::GlobalFederateId,__gnu_cxx::__ops::_Iter_less_val>
                             (pGVar1,pGVar2,&local_14),
     __position._M_current !=
     (this->delayedFederates).
     super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>._M_impl
     .super__Vector_impl_data._M_finish)) {
    if ((__position._M_current)->gid == local_14.gid) {
      return;
    }
    std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::insert
              (&this->delayedFederates,(const_iterator)__position._M_current,&local_14);
    return;
  }
  std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::push_back
            (&this->delayedFederates,&local_14);
  return;
}

Assistant:

void FederateState::addFederateToDelay(GlobalFederateId gid)
{
    if ((delayedFederates.empty()) || (gid > delayedFederates.back())) {
        delayedFederates.push_back(gid);
        return;
    }
    auto res = std::lower_bound(delayedFederates.begin(), delayedFederates.end(), gid);
    if (res == delayedFederates.end()) {
        delayedFederates.push_back(gid);
        return;
    }
    if (*res != gid) {
        delayedFederates.insert(res, gid);
    }
}